

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.cpp
# Opt level: O2

int __thiscall ncnn::Permute::forward(Permute *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint _w;
  size_t _elemsize;
  int i_3;
  int iVar2;
  ulong uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  int _c;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  undefined4 *puVar10;
  int i_1;
  ulong uVar11;
  int j;
  ulong uVar12;
  void *pvVar13;
  int i_2;
  int i;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long local_b0;
  int local_98;
  Mat local_70;
  
  uVar7 = bottom_blob->w;
  lVar16 = (long)(int)uVar7;
  uVar8 = bottom_blob->h;
  lVar14 = (long)(int)uVar8;
  _elemsize = bottom_blob->elemsize;
  uVar1 = this->order_type;
  if (bottom_blob->dims == 2) {
    if (uVar1 == 0) {
switchD_0014e464_caseD_0:
      Mat::operator=(top_blob,bottom_blob);
    }
    else if (uVar1 == 1) {
      Mat::create(top_blob,uVar8,uVar7,_elemsize,opt->blob_allocator);
      pvVar13 = top_blob->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      uVar3 = 0;
      if (0 < (int)uVar8) {
        uVar3 = (ulong)uVar8;
      }
      uVar6 = 0;
      if (0 < (int)uVar7) {
        uVar6 = (ulong)uVar7;
      }
      puVar10 = (undefined4 *)bottom_blob->data;
      for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
        puVar9 = puVar10;
        for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
          *(undefined4 *)((long)pvVar13 + uVar12 * 4) = *puVar9;
          puVar9 = puVar9 + lVar16;
        }
        pvVar13 = (void *)((long)pvVar13 + lVar14 * 4);
        puVar10 = puVar10 + 1;
      }
      return 0;
    }
    goto LAB_0014e473;
  }
  if (5 < uVar1) goto LAB_0014e473;
  _w = bottom_blob->c;
  switch(uVar1) {
  case 0:
    goto switchD_0014e464_caseD_0;
  case 1:
    Mat::create(top_blob,uVar8,uVar7,_w,_elemsize,opt->blob_allocator);
    iVar2 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar3 = 0;
      if (0 < (int)uVar8) {
        uVar3 = (ulong)uVar8;
      }
      uVar6 = 0;
      if (0 < (int)uVar7) {
        uVar6 = (ulong)uVar7;
      }
      uVar7 = 0;
      if (0 < (int)_w) {
        uVar7 = _w;
      }
      for (uVar8 = 0; iVar2 = 0, uVar8 != uVar7; uVar8 = uVar8 + 1) {
        Mat::channel(&local_70,bottom_blob,uVar8);
        puVar10 = (undefined4 *)local_70.data;
        Mat::~Mat(&local_70);
        Mat::channel(&local_70,top_blob,uVar8);
        puVar9 = (undefined4 *)local_70.data;
        Mat::~Mat(&local_70);
        for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
          puVar4 = puVar10;
          for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
            puVar9[uVar12] = *puVar4;
            puVar4 = puVar4 + lVar16;
          }
          puVar9 = puVar9 + lVar14;
          puVar10 = puVar10 + 1;
        }
      }
    }
    break;
  case 2:
    Mat::create(top_blob,uVar7,_w,uVar8,_elemsize,opt->blob_allocator);
    iVar2 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar3 = 0;
      if (0 < (int)uVar7) {
        uVar3 = (ulong)uVar7;
      }
      uVar6 = (ulong)_w;
      if ((int)_w < 1) {
        uVar6 = 0;
      }
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = 0;
      }
      _c = 0;
      while( true ) {
        iVar2 = 0;
        local_98 = (int)uVar11;
        if (_c == local_98) break;
        Mat::channel(&local_70,top_blob,_c);
        puVar10 = (undefined4 *)local_70.data;
        Mat::~Mat(&local_70);
        for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
          Mat::channel(&local_70,bottom_blob,(int)uVar12);
          pvVar13 = local_70.data;
          lVar14 = (long)(local_70.w * _c) * local_70.elemsize;
          Mat::~Mat(&local_70);
          for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
            puVar10[uVar5] = *(undefined4 *)((long)pvVar13 + uVar5 * 4 + lVar14);
          }
          puVar10 = puVar10 + lVar16;
        }
        _c = _c + 1;
      }
    }
    break;
  case 3:
    Mat::create(top_blob,_w,uVar7,uVar8,_elemsize,opt->blob_allocator);
    iVar2 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar3 = 0;
      if (0 < (int)_w) {
        uVar3 = (ulong)_w;
      }
      uVar6 = 0;
      if (0 < (int)uVar7) {
        uVar6 = (ulong)uVar7;
      }
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      for (uVar7 = 0; iVar2 = 0, uVar7 != uVar8; uVar7 = uVar7 + 1) {
        Mat::channel(&local_70,top_blob,uVar7);
        puVar10 = (undefined4 *)local_70.data;
        Mat::~Mat(&local_70);
        for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
          for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
            Mat::channel(&local_70,bottom_blob,(int)uVar12);
            pvVar13 = local_70.data;
            lVar14 = (long)local_70.w * (long)(int)uVar7 * local_70.elemsize;
            Mat::~Mat(&local_70);
            puVar10[uVar12] = *(undefined4 *)((long)pvVar13 + uVar11 * 4 + lVar14);
          }
          puVar10 = puVar10 + (int)_w;
        }
      }
    }
    break;
  case 4:
    Mat::create(top_blob,uVar8,_w,uVar7,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar3 = 0;
    if (0 < (int)uVar8) {
      uVar3 = (ulong)uVar8;
    }
    uVar6 = 0;
    if (0 < (int)_w) {
      uVar6 = (ulong)_w;
    }
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
    local_b0 = 0;
    for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      Mat::channel(&local_70,top_blob,(int)uVar12);
      puVar10 = (undefined4 *)local_70.data;
      Mat::~Mat(&local_70);
      for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
        Mat::channel(&local_70,bottom_blob,(int)uVar5);
        puVar9 = (undefined4 *)((long)local_70.data + local_b0);
        Mat::~Mat(&local_70);
        for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
          puVar10[uVar15] = *puVar9;
          puVar9 = puVar9 + lVar16;
        }
        puVar10 = puVar10 + lVar14;
      }
      local_b0 = local_b0 + 4;
    }
    goto LAB_0014e473;
  case 5:
    Mat::create(top_blob,_w,uVar8,uVar7,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar3 = 0;
    if (0 < (int)_w) {
      uVar3 = (ulong)_w;
    }
    uVar6 = 0;
    if (0 < (int)uVar8) {
      uVar6 = (ulong)uVar8;
    }
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
    for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      Mat::channel(&local_70,top_blob,(int)uVar12);
      puVar10 = (undefined4 *)local_70.data;
      Mat::~Mat(&local_70);
      for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
        for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
          Mat::channel(&local_70,bottom_blob,(int)uVar15);
          pvVar13 = local_70.data;
          Mat::~Mat(&local_70);
          puVar10[uVar15] = *(undefined4 *)((long)pvVar13 + (uVar5 * lVar16 + uVar12) * 4);
        }
        puVar10 = puVar10 + (int)_w;
      }
    }
LAB_0014e473:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Permute::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int dims = bottom_blob.dims;

    if (dims == 2)
    {
        // order_type
        // 0 = w h
        // 1 = h w

        if (order_type == 0)
        {
            top_blob = bottom_blob;
        }
        else if (order_type == 1)
        {
            top_blob.create(h, w, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = top_blob;

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }

        return 0;
    }

    // order_type
    // 0 = w h c
    // 1 = h w c
    // 2 = w c h
    // 3 = c w h
    // 4 = h c w
    // 5 = c h w

    if (order_type == 0)
    {
        top_blob = bottom_blob;
    }
    else if (order_type == 1)
    {
        top_blob.create(h, w, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }
    }
    else if (order_type == 2)
    {
        top_blob.create(w, channels, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i).row(q);

                for (int j = 0; j < w; j++)
                {
                    outptr[i*w + j] = ptr[j];
                }
            }
        }
    }
    else if (order_type == 3)
    {
        top_blob.create(channels, w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j).row(q);

                    outptr[i*channels + j] = ptr[i];
                }
            }
        }
    }
    else if (order_type == 4)
    {
        top_blob.create(h, channels, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i);

                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + q];
                }
            }
        }
    }
    else if (order_type == 5)
    {
        top_blob.create(channels, h, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j);

                    outptr[i*channels + j] = ptr[i*w + q];
                }
            }
        }
    }

    return 0;
}